

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O3

int WOPL_SaveBankToMem(WOPLFile *file,void *dest_mem,size_t length,uint16_t version,
                      uint16_t force_gm)

{
  uint uVar1;
  undefined8 uVar2;
  undefined6 in_register_0000000a;
  WOPLBank **ppWVar3;
  ushort *puVar4;
  char *__src;
  ushort version_00;
  undefined6 in_register_00000082;
  ulong uVar5;
  long lVar6;
  uint8_t *cursor;
  WOPLBank *pWVar7;
  bool bVar8;
  ushort local_68;
  ushort local_66;
  uint local_64;
  WOPLBank **local_60;
  ulong local_58;
  ulong local_50;
  WOPLBank *local_48;
  WOPLBank *pWStack_40;
  ulong local_38;
  
  local_66 = 1;
  local_68 = 1;
  if ((int)CONCAT62(in_register_00000082,force_gm) == 0) {
    local_66 = file->banks_count_melodic;
    local_68 = file->banks_count_percussion;
  }
  uVar5 = 3;
  if (version != 0) {
    uVar5 = CONCAT62(in_register_0000000a,version) & 0xffffffff;
  }
  if (10 < length) {
    *(undefined8 *)dest_mem = 0x41422d334c504f57;
    *(undefined4 *)((long)dest_mem + 7) = 0x4b4e41;
    if (1 < length - 0xb) {
      *(ushort *)((long)dest_mem + 0xb) = (ushort)uVar5;
      if (((1 < length - 0xd) &&
          (*(ushort *)((long)dest_mem + 0xd) = local_66 << 8 | local_66 >> 8, 1 < length - 0xf)) &&
         (*(ushort *)((long)dest_mem + 0xf) = local_68 << 8 | local_68 >> 8, 1 < length - 0x11)) {
        __src = (char *)&pWStack_40;
        *(uint8_t *)((long)dest_mem + 0x11) = file->opl_flags;
        *(uint8_t *)((long)dest_mem + 0x12) = file->volume_model;
        cursor = (uint8_t *)((long)dest_mem + 0x13);
        local_50 = length - 0x13;
        local_48 = file->banks_melodic;
        pWStack_40 = file->banks_percussive;
        if (1 < (ushort)uVar5) {
          local_60 = &local_48;
          uVar2 = CONCAT71((int7)((ulong)local_60 >> 8),1);
          local_64 = (uint)uVar5;
          puVar4 = &local_66;
          do {
            local_58 = CONCAT44(local_58._4_4_,(int)uVar2);
            if (*puVar4 != 0) {
              lVar6 = 0;
              uVar5 = 0;
              do {
                ppWVar3 = local_60;
                bVar8 = local_50 < 0x22;
                local_50 = local_50 - 0x22;
                if (bVar8) {
                  return 2;
                }
                pWVar7 = *local_60;
                __src = pWVar7->bank_name + lVar6;
                strncpy((char *)cursor,__src,0x20);
                cursor[0x20] = pWVar7->ins[0].inst_name[lVar6 + -3];
                cursor[0x21] = (*ppWVar3)->ins[0].inst_name[lVar6 + -2];
                cursor = cursor + 0x22;
                uVar5 = uVar5 + 1;
                lVar6 = lVar6 + 0x2224;
              } while (uVar5 < *puVar4);
            }
            local_60 = &pWStack_40;
            uVar2 = 0;
            uVar5 = (ulong)local_64;
            puVar4 = &local_68;
          } while ((local_58 & 1) != 0);
        }
        ppWVar3 = &local_48;
        version_00 = (ushort)uVar5;
        uVar1 = (uint)(2 < version_00) * 0x200 + 0x1f00;
        local_58 = (ulong)uVar1;
        local_38 = (ulong)(ushort)uVar1;
        uVar2 = CONCAT71((int7)((ulong)__src >> 8),1);
        puVar4 = &local_66;
        while (local_60 = (WOPLBank **)(ulong)*puVar4, (long)local_60 * local_38 <= local_50) {
          local_64 = (uint)uVar2;
          if (local_60 != (WOPLBank **)0x0) {
            pWVar7 = *ppWVar3;
            uVar5 = 0;
            do {
              lVar6 = 0x24;
              do {
                WOPL_writeInstrument
                          ((WOPLInstrument *)(pWVar7->bank_name + lVar6),cursor,version_00,'\x01');
                cursor = cursor + (ulong)(2 < version_00) * 4 + 0x3e;
                lVar6 = lVar6 + 0x44;
              } while (lVar6 != 0x2224);
              local_50 = local_50 - local_58;
              uVar5 = uVar5 + 1;
              pWVar7 = pWVar7 + 1;
            } while ((WOPLBank **)uVar5 != local_60);
          }
          ppWVar3 = &pWStack_40;
          uVar2 = 0;
          puVar4 = &local_68;
          if ((local_64 & 1) == 0) {
            return 0;
          }
        }
      }
    }
  }
  return 2;
}

Assistant:

int WOPL_SaveBankToMem(WOPLFile *file, void *dest_mem, size_t length, uint16_t version, uint16_t force_gm)
{
    uint8_t *cursor = (uint8_t *)dest_mem;
    uint16_t ins_size = 0;
    uint16_t i, j, k;
    uint16_t banks_melodic = force_gm ? 1 : file->banks_count_melodic;
    uint16_t banks_percusive = force_gm ? 1 : file->banks_count_percussion;

    WOPLBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

    if(version == 0)
        version = wopl_latest_version;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(length < 11)
        return WOPL_ERR_UNEXPECTED_ENDING;
    memcpy(cursor, wopl3_magic, 11);
    GO_FORWARD(11);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16LE(version, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_melodic, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_percusive, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    cursor[0] = file->opl_flags;
    cursor[1] = file->volume_model;
    GO_FORWARD(2);

    bankslots[0]        = file->banks_melodic;
    bankslots_sizes[0]  = banks_melodic;
    bankslots[1]        = file->banks_percussive;
    bankslots_sizes[1]  = banks_percusive;

    if(version >= 2)
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                    return WOPL_ERR_UNEXPECTED_ENDING;
                strncpy((char*)cursor, bankslots[i][j].bank_name, 32);
                cursor[32] = bankslots[i][j].bank_midi_lsb;
                cursor[33] = bankslots[i][j].bank_midi_msb;
                GO_FORWARD(34);
            }
        }
    }

    {/* Write instruments data */
        if(version >= 3)
            ins_size = WOPL_INST_SIZE_V3;
        else
            ins_size = WOPL_INST_SIZE_V2;
        for(i = 0; i < 2; i++)
        {
            if(length < (ins_size * 128) * (size_t)bankslots_sizes[i])
                return WOPL_ERR_UNEXPECTED_ENDING;

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPLInstrument *ins = &bankslots[i][j].ins[k];
                    WOPL_writeInstrument(ins, cursor, version, 1);
                    GO_FORWARD(ins_size);
                }
            }
        }
    }

    return WOPL_ERR_OK;
#undef GO_FORWARD
}